

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn-state-machine.h
# Opt level: O0

void __thiscall dynet::RNNStateMachine::transition(RNNStateMachine *this,RNNOp op)

{
  int iVar1;
  int in_ESI;
  RNNOp RVar2;
  int *in_RDI;
  
  iVar1 = *in_RDI;
  RVar2 = (RNNOp)in_RDI;
  if (iVar1 == 0) {
    if (in_ESI == 0) {
      *in_RDI = 1;
      return;
    }
    dynet::RNNStateMachine::failure(RVar2);
  }
  else if (iVar1 != 1) {
    if (iVar1 != 2) {
      return;
    }
    goto LAB_001715e1;
  }
  if (in_ESI == 0) {
    return;
  }
  if (in_ESI == 1) {
    *in_RDI = 2;
    return;
  }
  dynet::RNNStateMachine::failure(RVar2);
LAB_001715e1:
  if ((in_ESI != 2) && (in_ESI != 1)) {
    if (in_ESI == 0) {
      *in_RDI = 1;
    }
    else {
      dynet::RNNStateMachine::failure(RVar2);
    }
  }
  return;
}

Assistant:

void transition(RNNOp op) {
    switch (q_) {
      case RNNState::CREATED:
        if (op == RNNOp::new_graph) { q_ = RNNState::GRAPH_READY; break; }
        failure(op);
      case RNNState::GRAPH_READY:
        if (op == RNNOp::new_graph) { break; }
        if (op == RNNOp::start_new_sequence) { q_ = RNNState::READING_INPUT; break; }
        failure(op);
      case RNNState::READING_INPUT:
        if (op == RNNOp::add_input) { break; }
        if (op == RNNOp::start_new_sequence) { break; }
        if (op == RNNOp::new_graph) { q_ = RNNState::GRAPH_READY; break; }
        failure(op);
    }
  }